

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenTableFieldGetter(CppGenerator *this,FieldDef *field)

{
  Value *type;
  CodeWriter *pCVar1;
  uint uVar2;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string afterptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> call;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> opt_value;
  string wire_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string face_type;
  string offset_str;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  GenFieldOffsetName_abi_cxx11_(&offset_str,this,field);
  GenComment(this,&(field->super_Definition).doc_comment,"  ");
  type = &field->value;
  uVar2 = (field->value).type.base_type - BASE_TYPE_UTYPE;
  if ((uVar2 < 0xc) && (field->presence == kOptional)) {
    GenTypeBasic_abi_cxx11_(&wire_type,this,&type->type,false);
    GenTypeBasic_abi_cxx11_(&face_type,this,&type->type,true);
    std::operator+(&local_148,"GetOptional<",&wire_type);
    std::operator+(&local_1a8,&local_148,", ");
    std::operator+(&local_208,&local_1a8,&face_type);
    std::operator+(&afterptr,&local_208,">(");
    std::operator+(&call,&afterptr,&offset_str);
    std::operator+(&opt_value,&call,")");
    std::__cxx11::string::~string((string *)&call);
    std::__cxx11::string::~string((string *)&afterptr);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&call,"FIELD_TYPE",(allocator<char> *)&local_208);
    GenOptionalDecl_abi_cxx11_(&afterptr,this,&type->type);
    pCVar1 = &this->code_;
    CodeWriter::SetValue(pCVar1,&call,&afterptr);
    std::__cxx11::string::~string((string *)&afterptr);
    std::__cxx11::string::~string((string *)&call);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"  {{FIELD_TYPE}} {{FIELD_NAME}}() const {",
               (allocator<char> *)&call);
    CodeWriter::operator+=(pCVar1,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::operator+(&call,"    return ",&opt_value);
    std::operator+(&local_c8,&call,";");
    CodeWriter::operator+=(pCVar1,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&call);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"  }",(allocator<char> *)&call);
    CodeWriter::operator+=(pCVar1,&local_e8);
    this_00 = &local_e8;
  }
  else {
    wire_type._M_dataplus._M_p = (pointer)&wire_type.field_2;
    wire_type._M_string_length = 0;
    wire_type.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&face_type,"",(allocator<char> *)&opt_value);
    std::__cxx11::string::assign((char *)&wire_type);
    GenTypeGet_abi_cxx11_(&opt_value,this,&type->type,"","const "," *",false);
    std::operator+(&local_208,&wire_type,&opt_value);
    std::operator+(&afterptr,&local_208,">(");
    std::operator+(&call,&afterptr,&offset_str);
    std::__cxx11::string::~string((string *)&afterptr);
    std::__cxx11::string::~string((string *)&local_208);
    if (uVar2 < 0xc) {
      GenDefaultConstant_abi_cxx11_(&local_208,this,field);
      std::operator+(&afterptr,", ",&local_208);
      std::__cxx11::string::append((string *)&call);
      std::__cxx11::string::~string((string *)&afterptr);
      std::__cxx11::string::~string((string *)&local_208);
    }
    std::__cxx11::string::append((char *)&call);
    NullableExtension_abi_cxx11_(&local_208,this);
    std::operator+(&afterptr," *",&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"FIELD_TYPE",(allocator<char> *)&local_148);
    GenTypeGet_abi_cxx11_(&local_1a8,this,&type->type," ","const ",afterptr._M_dataplus._M_p,true);
    pCVar1 = &this->code_;
    CodeWriter::SetValue(pCVar1,&local_208,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"FIELD_VALUE",(allocator<char> *)&local_148);
    GenUnderlyingCast(&local_1a8,this,field,true,&call);
    CodeWriter::SetValue(pCVar1,&local_208,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"NULLABLE_EXT",(allocator<char> *)&local_148);
    NullableExtension_abi_cxx11_(&local_1a8,this);
    CodeWriter::SetValue(pCVar1,&local_208,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"  {{FIELD_TYPE}}{{FIELD_NAME}}() const {",
               (allocator<char> *)&local_208);
    CodeWriter::operator+=(pCVar1,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"    return {{FIELD_VALUE}};",(allocator<char> *)&local_208);
    CodeWriter::operator+=(pCVar1,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"  }",(allocator<char> *)&local_208);
    CodeWriter::operator+=(pCVar1,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&afterptr);
    this_00 = &call;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&opt_value);
  std::__cxx11::string::~string((string *)&face_type);
  std::__cxx11::string::~string((string *)&wire_type);
  if ((type->type).base_type == BASE_TYPE_UNION) {
    GenTableUnionAsGetters(this,field);
  }
  std::__cxx11::string::~string((string *)&offset_str);
  return;
}

Assistant:

void GenTableFieldGetter(const FieldDef &field) {
    const auto &type = field.value.type;
    const auto offset_str = GenFieldOffsetName(field);

    GenComment(field.doc_comment, "  ");
    // Call a different accessor for pointers, that indirects.
    if (!field.IsScalarOptional()) {
      const bool is_scalar = IsScalar(type.base_type);
      std::string accessor;
      std::string offset_size = "";
      if (is_scalar) {
        accessor = "GetField<";
      } else if (IsStruct(type)) {
        accessor = "GetStruct<";
      } else {
        if (field.offset64) {
          accessor = "GetPointer64<";
        } else {
          accessor = "GetPointer<";
        }
      }
      auto offset_type = GenTypeGet(type, "", "const ", " *", false);
      auto call = accessor + offset_type + ">(" + offset_str;
      // Default value as second arg for non-pointer types.
      if (is_scalar) { call += ", " + GenDefaultConstant(field); }
      call += ")";

      std::string afterptr = " *" + NullableExtension();
      code_.SetValue("FIELD_TYPE",
                     GenTypeGet(type, " ", "const ", afterptr.c_str(), true));
      code_.SetValue("FIELD_VALUE", GenUnderlyingCast(field, true, call));
      code_.SetValue("NULLABLE_EXT", NullableExtension());
      code_ += "  {{FIELD_TYPE}}{{FIELD_NAME}}() const {";
      code_ += "    return {{FIELD_VALUE}};";
      code_ += "  }";
    } else {
      auto wire_type = GenTypeBasic(type, false);
      auto face_type = GenTypeBasic(type, true);
      auto opt_value = "GetOptional<" + wire_type + ", " + face_type + ">(" +
                       offset_str + ")";
      code_.SetValue("FIELD_TYPE", GenOptionalDecl(type));
      code_ += "  {{FIELD_TYPE}} {{FIELD_NAME}}() const {";
      code_ += "    return " + opt_value + ";";
      code_ += "  }";
    }

    if (type.base_type == BASE_TYPE_UNION) { GenTableUnionAsGetters(field); }
  }